

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

void __thiscall
duckdb::CatalogSet::Scan(CatalogSet *this,function<void_(duckdb::CatalogEntry_&)> *callback)

{
  type current;
  CatalogEntry *__args;
  _Base_ptr p_Var1;
  CatalogSet *this_00;
  
  ::std::mutex::lock(&this->catalog_lock);
  for (p_Var1 = (this->map).entries._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->map).entries._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)::std::_Rb_tree_increment(p_Var1)) {
    this_00 = (CatalogSet *)(p_Var1 + 2);
    current = unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>::
              operator*((unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>
                         *)this_00);
    __args = GetCommittedEntry(this_00,current);
    if (__args->deleted == false) {
      ::std::function<void_(duckdb::CatalogEntry_&)>::operator()(callback,__args);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->catalog_lock);
  return;
}

Assistant:

void CatalogSet::Scan(const std::function<void(CatalogEntry &)> &callback) {
	// lock the catalog set
	lock_guard<mutex> lock(catalog_lock);
	for (auto &kv : map.Entries()) {
		auto &entry = *kv.second;
		auto &commited_entry = GetCommittedEntry(entry);
		if (!commited_entry.deleted) {
			callback(commited_entry);
		}
	}
}